

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_makers.hpp
# Opt level: O2

void so_5::details::handlers_bunch_basics_t::prepare_handlers
               (msg_type_and_handler_pair_t *left,msg_type_and_handler_pair_t *right)

{
  char *pcVar1;
  msg_type_and_handler_pair_t *pmVar2;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__sort<so_5::details::msg_type_and_handler_pair_t*,__gnu_cxx::__ops::_Iter_less_iter>();
  pmVar2 = std::
           __adjacent_find<so_5::details::msg_type_and_handler_pair_t*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (left,right);
  if (pmVar2 != right) {
    std::__cxx11::string::string
              ((string *)&local_30,"several handlers are defined for message; msg_type: ",&local_51)
    ;
    pcVar1 = *(char **)((pmVar2->m_msg_type)._M_target + 8);
    std::operator+(&local_50,&local_30,pcVar1 + (*pcVar1 == '*'));
    exception_t::raise(0x28113b);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

static inline void
		prepare_handlers(
			msg_type_and_handler_pair_t * left,
			msg_type_and_handler_pair_t * right )
			{
				std::sort( left, right );
				auto duplicate = std::adjacent_find( left, right );
				if( duplicate != right )
					SO_5_THROW_EXCEPTION( rc_several_handlers_for_one_message_type,
							std::string( "several handlers are defined for message; "
									"msg_type: " ) + duplicate->m_msg_type.name() );
			}